

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::CopyJsonNameTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  LogMessage *other;
  FieldDescriptor *pFVar3;
  FieldDescriptorProto *pFVar4;
  Descriptor *this_00;
  DescriptorProto *proto_00;
  int local_6c;
  int local_68;
  int i_2;
  int i_1;
  int i;
  LogMessage local_50;
  DescriptorProto *local_18;
  DescriptorProto *proto_local;
  Descriptor *this_local;
  
  local_18 = proto;
  proto_local = (DescriptorProto *)this;
  iVar1 = field_count(this);
  iVar2 = DescriptorProto::field_size(local_18);
  if (iVar1 == iVar2) {
    iVar1 = nested_type_count(this);
    iVar2 = DescriptorProto::nested_type_size(local_18);
    if (iVar1 == iVar2) {
      iVar1 = extension_count(this);
      iVar2 = DescriptorProto::extension_size(local_18);
      if (iVar1 == iVar2) {
        for (i_2 = 0; iVar1 = field_count(this), i_2 < iVar1; i_2 = i_2 + 1) {
          pFVar3 = field(this,i_2);
          pFVar4 = DescriptorProto::mutable_field(local_18,i_2);
          FieldDescriptor::CopyJsonNameTo(pFVar3,pFVar4);
        }
        for (local_68 = 0; iVar1 = nested_type_count(this), local_68 < iVar1;
            local_68 = local_68 + 1) {
          this_00 = nested_type(this,local_68);
          proto_00 = DescriptorProto::mutable_nested_type(local_18,local_68);
          CopyJsonNameTo(this_00,proto_00);
        }
        for (local_6c = 0; iVar1 = extension_count(this), local_6c < iVar1; local_6c = local_6c + 1)
        {
          pFVar3 = extension(this,local_6c);
          pFVar4 = DescriptorProto::mutable_extension(local_18,local_6c);
          FieldDescriptor::CopyJsonNameTo(pFVar3,pFVar4);
        }
        return;
      }
    }
  }
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
             ,0xa84);
  other = internal::LogMessage::operator<<
                    (&local_50,"Cannot copy json_name to a proto of a different size.");
  internal::LogFinisher::operator=((LogFinisher *)((long)&i_1 + 3),other);
  internal::LogMessage::~LogMessage(&local_50);
  return;
}

Assistant:

void Descriptor::CopyJsonNameTo(DescriptorProto* proto) const {
  if (field_count() != proto->field_size() ||
      nested_type_count() != proto->nested_type_size() ||
      extension_count() != proto->extension_size()) {
    GOOGLE_LOG(ERROR) << "Cannot copy json_name to a proto of a different size.";
    return;
  }
  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyJsonNameTo(proto->mutable_field(i));
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyJsonNameTo(proto->mutable_nested_type(i));
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyJsonNameTo(proto->mutable_extension(i));
  }
}